

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffee0;
  Mat *m;
  Mat *in_stack_fffffffffffffee8;
  Mat *this_00;
  Mat local_100;
  Mat local_b8;
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
  ncnn::Mat::operator=(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  ncnn::Mat::~Mat((Mat *)0x70f762);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    this_00 = &local_b8;
    (**(code **)(*local_18 + 0x10))(this_00,local_18,*(undefined4 *)(in_RDI + 0xd4),1);
    ncnn::Mat::operator=(this_00,in_stack_fffffffffffffee0);
    ncnn::Mat::~Mat((Mat *)0x70f7fc);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd8) != 0) {
        m = &local_100;
        (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)(in_RDI + 0xd8),1);
        ncnn::Mat::operator=(this_00,m);
        ncnn::Mat::~Mat((Mat *)0x70f8a5);
        bVar1 = ncnn::Mat::empty(m);
        if (bVar1) {
          return -100;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    scale_in_data = mb.load(scale_in_data_size, 1);
    if (scale_in_data.empty())
        return -100;

    scale_out_data = mb.load(scale_out_data_size, 1);
    if (scale_out_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}